

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  ChannelData *pCVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  CompressorScheme CVar5;
  exr_encode_pipeline_t *peVar6;
  undefined8 *__s;
  ulong uVar7;
  undefined8 *puVar8;
  ChannelData *pCVar9;
  CscChannelSet *pCVar10;
  exr_coding_channel_info_t *peVar11;
  uint8_t *puVar12;
  exr_const_context_t_conflict p_Var13;
  void *in;
  exr_result_t eVar14;
  int iVar15;
  exr_result_t eVar16;
  ulong uVar17;
  char *pcVar18;
  uint64_t uVar19;
  size_t sVar20;
  long lVar21;
  size_t sVar22;
  uint16_t *puVar23;
  size_t sVar24;
  unsigned_short *toNonlinear;
  ulong uVar25;
  Classifier *me_00;
  uint8_t *puVar26;
  uint uVar27;
  uint8_t *puVar28;
  int byte;
  long lVar29;
  int c;
  size_t y;
  long lVar30;
  void *local_3c8;
  ulong local_3c0;
  uint8_t *local_3b0;
  size_t outBufferSize;
  LossyDctEncoder enc;
  
  outBufferSize = 0;
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  DwaCompressor_initializeBuffers(me,&outBufferSize);
  sVar24 = outBufferSize;
  peVar6 = me->_encode;
  eVar14 = 1;
  if ((0x57 < peVar6->compressed_alloc_size) &&
     (eVar14 = internal_encode_alloc_buffer
                         (peVar6,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar6->compressed_buffer,
                          &peVar6->compressed_alloc_size,outBufferSize), eVar14 == 0)) {
    __s = (undefined8 *)me->_encode->compressed_buffer;
    memset(__s,0,me->_encode->compressed_alloc_size);
    eVar14 = 1;
    if (1 < sVar24) {
      encbytes = __s + 3;
      local_3c8 = (void *)((long)__s + 0x5a);
      local_3c0 = 2;
      for (uVar25 = 0; uVar7 = me->_channelRuleCount, uVar25 < uVar7; uVar25 = uVar25 + 1) {
        uVar17 = (ulong)(uint)me->_numChannels;
        if (me->_numChannels < 1) {
          uVar17 = 0;
        }
        lVar21 = 0;
        do {
          if (uVar17 * 0x240 + 0x240 == lVar21 + 0x240) goto LAB_00107593;
          puVar8 = *(undefined8 **)((long)me->_channelData->planarUncRle + lVar21 + -0x18);
          pcVar18 = Classifier_find_suffix((char *)*puVar8);
          me_00 = me->_channelRules + uVar25;
          iVar15 = Classifier_match(me_00,pcVar18,(uint)*(ushort *)((long)puVar8 + 0x1a));
          lVar21 = lVar21 + 0x240;
        } while (iVar15 == 0);
        uVar19 = Classifier_size(me_00);
        if (sVar24 < uVar19 + local_3c0) break;
        pcVar18 = me_00->_suffix;
        sVar20 = strlen(pcVar18);
        memcpy(local_3c8,pcVar18,sVar20 + 1);
        *(byte *)((long)local_3c8 + sVar20 + 1) =
             ((byte)me_00->_caseInsensitive & 1 |
             (char)(me_00->_cscIdx << 4) + ((byte)me_00->_scheme & 3) * '\x04') + 0x10;
        *(char *)((long)local_3c8 + sVar20 + 2) = (char)me_00->_type;
        local_3c0 = local_3c0 + sVar20 + 3;
        local_3c8 = (void *)((long)local_3c8 + sVar20 + 3);
LAB_00107593:
      }
      if (uVar25 < uVar7) {
        eVar14 = 1;
      }
      else {
        eVar14 = 1;
        if (local_3c0 < 0x10000) {
          *(short *)(__s + 0xb) = (short)local_3c0;
          local_3c0 = local_3c0 + 0x58;
          if (local_3c0 < me->_encode->compressed_alloc_size) {
            puVar28 = me->_packedAcBuffer;
            local_3b0 = me->_packedDcBuffer;
            *__s = 2;
            __s[10] = (ulong)me->_acCompression;
            DwaCompressor_setupChannelData(me);
            uVar27 = me->_numChannels;
            lVar21 = 0;
            uVar25 = 0;
            if (0 < (int)uVar27) {
              uVar25 = (ulong)uVar27;
            }
            for (; uVar25 * 0x240 - lVar21 != 0; lVar21 = lVar21 + 0x240) {
              puVar26 = me->_channelData->_pad + lVar21 + -0xc;
              puVar26[0] = '\0';
              puVar26[1] = '\0';
              puVar26[2] = '\0';
              puVar26[3] = '\0';
            }
            puVar26 = (uint8_t *)me->_encode->packed_buffer;
            iVar15 = me->_min[1];
            while( true ) {
              eVar14 = 0;
              iVar3 = me->_max[1];
              if (iVar3 < iVar15) break;
              lVar30 = 0;
              for (lVar21 = 0; lVar21 < (int)uVar27; lVar21 = lVar21 + 1) {
                lVar29 = *(long *)((long)me->_channelData->planarUncRle + lVar30 + -0x18);
                if (iVar15 % *(int *)(lVar29 + 0x14) == 0) {
                  eVar14 = DctCoderChannelData_push_row
                                     (me->alloc_fn,me->free_fn,
                                      (DctCoderChannelData *)
                                      ((long)(me->_channelData->_dctData)._dctData + lVar30),puVar26
                                     );
                  if (eVar14 != 0) {
                    eVar14 = 1;
                    if (iVar15 <= iVar3) {
                      return 1;
                    }
                    goto LAB_001076d5;
                  }
                  puVar26 = puVar26 + (long)*(char *)(lVar29 + 0x19) * (long)*(int *)(lVar29 + 0xc);
                  uVar27 = me->_numChannels;
                }
                lVar30 = lVar30 + 0x240;
              }
              iVar15 = iVar15 + 1;
            }
LAB_001076d5:
            lVar21 = 8;
            for (lVar30 = 0; lVar30 < me->_numCscChannelSets; lVar30 = lVar30 + 1) {
              pCVar9 = me->_channelData;
              pCVar10 = me->_cscChannelSets;
              iVar15 = *(int *)((long)pCVar10->idx + lVar21 + -8);
              iVar3 = *(int *)((long)pCVar10->idx + lVar21 + -4);
              iVar4 = *(int *)((long)pCVar10->idx + lVar21);
              LossyDctEncoder_base_construct
                        (&enc,me->_dwaCompressionLevel / 100000.0,puVar28,local_3b0,
                         dwaCompressorToNonlinear,(pCVar9[iVar15].chan)->width,
                         (pCVar9[iVar15].chan)->height);
              enc._channel_encode_data_count = 3;
              enc._channel_encode_data[0] = &pCVar9[iVar15]._dctData;
              enc._channel_encode_data[1] = &pCVar9[iVar3]._dctData;
              enc._channel_encode_data[2] = &pCVar9[iVar4]._dctData;
              eVar14 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&enc);
              __s[8] = __s[8] + enc._numAcComp;
              __s[9] = __s[9] + enc._numDcComp;
              pCVar9 = me->_channelData;
              pCVar9[*(int *)((long)pCVar10->idx + lVar21 + -8)].processed = 1;
              pCVar9[*(int *)((long)pCVar10->idx + lVar21 + -4)].processed = 1;
              pCVar9[*(int *)((long)pCVar10->idx + lVar21)].processed = 1;
              if (eVar14 != 0) {
                return 1;
              }
              local_3b0 = local_3b0 + enc._numDcComp * 2;
              puVar28 = puVar28 + enc._numAcComp * 2;
              lVar21 = lVar21 + 0xc;
              eVar14 = 0;
            }
            lVar30 = 0x1f8;
            for (lVar21 = 0; lVar21 < me->_numChannels; lVar21 = lVar21 + 1) {
              pCVar9 = me->_channelData;
              if (pCVar9[lVar21].processed == 0) {
                pCVar1 = pCVar9 + lVar21;
                peVar11 = pCVar9[lVar21].chan;
                CVar5 = pCVar1->compression;
                if (CVar5 == UNKNOWN) {
                  sVar20 = (long)peVar11->bytes_per_element * (long)peVar11->width;
                  for (uVar25 = 0; uVar25 < (pCVar1->_dctData)._size; uVar25 = uVar25 + 1) {
                    memcpy(pCVar1->planarUncBufferEnd,(pCVar1->_dctData)._rows[uVar25],sVar20);
                    pCVar1->planarUncBufferEnd = pCVar1->planarUncBufferEnd + sVar20;
                  }
                  __s[1] = __s[1] + pCVar1->planarUncSize;
                }
                else if (CVar5 == LOSSY_DCT) {
                  eVar14 = 0;
                  toNonlinear = (uint16_t *)0x0;
                  if (peVar11->p_linear == '\0') {
                    toNonlinear = dwaCompressorToNonlinear;
                  }
                  LossyDctEncoder_base_construct
                            (&enc,me->_dwaCompressionLevel / 100000.0,puVar28,local_3b0,toNonlinear,
                             peVar11->width,peVar11->height);
                  enc._channel_encode_data_count = 1;
                  enc._channel_encode_data[0] = &pCVar1->_dctData;
                  eVar16 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&enc);
                  __s[8] = enc._numAcComp + __s[8];
                  __s[9] = enc._numDcComp + __s[9];
                  if (eVar16 != 0) {
                    return 1;
                  }
                  puVar28 = puVar28 + enc._numAcComp * 2;
                  local_3b0 = local_3b0 + enc._numDcComp * 2;
                }
                else {
                  if (CVar5 != RLE) {
                    return 3;
                  }
                  for (uVar25 = 0; uVar25 < (pCVar1->_dctData)._size; uVar25 = uVar25 + 1) {
                    puVar26 = (pCVar1->_dctData)._rows[uVar25];
                    for (iVar15 = 0; iVar15 < peVar11->width; iVar15 = iVar15 + 1) {
                      for (lVar29 = 0; lVar29 < peVar11->bytes_per_element; lVar29 = lVar29 + 1) {
                        uVar2 = puVar26[lVar29];
                        puVar12 = *(uint8_t **)
                                   ((long)(pCVar9->_dctData)._dctData + lVar29 * 8 + lVar30);
                        *(uint8_t **)((long)(pCVar9->_dctData)._dctData + lVar29 * 8 + lVar30) =
                             puVar12 + 1;
                        *puVar12 = uVar2;
                      }
                      puVar26 = puVar26 + lVar29;
                    }
                    __s[7] = __s[7] + (long)peVar11->bytes_per_element * (long)peVar11->width;
                  }
                }
                pCVar1->processed = 1;
              }
              lVar30 = lVar30 + 0x240;
            }
            sVar24 = __s[1];
            if (sVar24 != 0) {
              puVar28 = me->_planarUncBuffer[0];
              p_Var13 = me->_encode->context;
              sVar22 = exr_compress_max_buffer_size(sVar24);
              eVar14 = exr_compress_buffer(p_Var13,9,puVar28,sVar24,local_3c8,sVar22,(size_t *)&enc)
              ;
              if (eVar14 != 0) {
                return eVar14;
              }
              local_3c8 = (void *)((long)local_3c8 + (long)enc._toNonlinear);
              __s[2] = enc._toNonlinear;
              local_3c0 = local_3c0 + (long)enc._toNonlinear;
              eVar14 = 0;
            }
            uVar19 = __s[8];
            if (uVar19 != 0) {
              if (me->_acCompression == DEFLATE) {
                puVar28 = me->_packedAcBuffer;
                p_Var13 = me->_encode->context;
                sVar24 = exr_compress_max_buffer_size(uVar19 * 2);
                eVar14 = exr_compress_buffer(p_Var13,9,puVar28,uVar19 * 2,local_3c8,sVar24,
                                             (size_t *)&enc);
                if (eVar14 != 0) {
                  return eVar14;
                }
                *encbytes = (uint64_t)enc._toNonlinear;
                puVar23 = enc._toNonlinear;
              }
              else {
                if (me->_acCompression != STATIC_HUFFMAN) {
                  return 3;
                }
                eVar14 = internal_huf_compress
                                   (encbytes,local_3c8,(long)__s + (outBufferSize - (long)local_3c8)
                                    ,(uint16_t *)me->_packedAcBuffer,uVar19,
                                    me->_encode->scratch_buffer_1,me->_encode->scratch_alloc_size_1)
                ;
                if (eVar14 == 4) {
                  peVar6 = me->_encode;
                  memcpy(peVar6->compressed_buffer,peVar6->packed_buffer,peVar6->packed_alloc_size);
                  me->_encode->compressed_bytes = me->_encode->packed_alloc_size;
                  return 0;
                }
                if (eVar14 != 0) {
                  return eVar14;
                }
                puVar23 = (uint16_t *)*encbytes;
              }
              local_3c8 = (void *)((long)local_3c8 + (long)puVar23);
              local_3c0 = local_3c0 + (long)puVar23;
              eVar14 = 0;
            }
            if (__s[9] != 0) {
              sVar24 = __s[9] * 2;
              peVar6 = me->_encode;
              eVar14 = internal_encode_alloc_buffer
                                 (peVar6,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar6->scratch_buffer_1,
                                  &peVar6->scratch_alloc_size_1,sVar24);
              if (eVar14 != 0) {
                return eVar14;
              }
              internal_zip_deconstruct_bytes
                        ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar24);
              iVar15 = me->_zipLevel;
              p_Var13 = me->_encode->context;
              in = me->_encode->scratch_buffer_1;
              sVar22 = exr_compress_max_buffer_size(sVar24);
              eVar14 = exr_compress_buffer(p_Var13,iVar15,in,sVar24,local_3c8,sVar22,(size_t *)&enc)
              ;
              if (eVar14 != 0) {
                return eVar14;
              }
              __s[4] = enc._toNonlinear;
              local_3c8 = (void *)((long)local_3c8 + (long)enc._toNonlinear);
              local_3c0 = local_3c0 + (long)enc._toNonlinear;
              eVar14 = 0;
            }
            if (__s[7] != 0) {
              uVar19 = internal_rle_compress
                                 (me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7]);
              __s[6] = uVar19;
              puVar28 = me->_rleBuffer;
              p_Var13 = me->_encode->context;
              sVar24 = exr_compress_max_buffer_size(uVar19);
              eVar14 = exr_compress_buffer(p_Var13,9,puVar28,uVar19,local_3c8,sVar24,(size_t *)&enc)
              ;
              if (eVar14 != 0) {
                return eVar14;
              }
              __s[5] = enc._toNonlinear;
              local_3c8 = (void *)((long)local_3c8 + (long)enc._toNonlinear);
              local_3c0 = local_3c0 + (long)enc._toNonlinear;
              eVar14 = 0;
            }
            peVar6 = me->_encode;
            if (local_3c0 == (long)local_3c8 - (long)peVar6->compressed_buffer) {
              if (local_3c0 < peVar6->packed_bytes) {
                peVar6->compressed_bytes = local_3c0;
              }
              else {
                memcpy(peVar6->compressed_buffer,peVar6->packed_buffer,peVar6->packed_bytes);
                me->_encode->compressed_bytes = me->_encode->packed_bytes;
              }
            }
            else {
              eVar14 = 0x17;
            }
          }
        }
      }
    }
  }
  return eVar14;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t*    sizes;
    size_t       outBufferSize = 0;
    uint64_t     dataBytes, nWritten = 0;
    uint64_t     nAvail;
    uint64_t     fileVersion = 2;
    uint64_t*    version;
    uint64_t*    unknownUncompressedSize;
    uint64_t*    unknownCompressedSize;
    uint64_t*    acCompressedSize;
    uint64_t*    dcCompressedSize;
    uint64_t*    rleCompressedSize;
    uint64_t*    rleUncompressedSize;
    uint64_t*    rleRawSize;

    uint64_t* totalAcUncompressedCount;
    uint64_t* totalDcUncompressedCount;

    uint64_t* acCompression;
    uint8_t*  packedAcEnd;
    uint8_t*  packedDcEnd;
    uint8_t*  outDataPtr;
    uint8_t*  inDataPtr;

    // Starting with DWA v2, we write the channel
    // classification rules into the file
    me->_channelRules     = sDefaultChannelRules;
    me->_channelRuleCount = sizeof (sDefaultChannelRules) / sizeof (Classifier);

    rv = DwaCompressor_initializeBuffers (me, &outBufferSize);

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail = outBufferSize;
    sizes  = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    version                 = OBIDX (VERSION);
    unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    rleRawSize              = OBIDX (RLE_RAW_SIZE);

    totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    acCompression = OBIDX (AC_COMPRESSION);
    packedAcEnd   = NULL;
    packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    outDataPtr = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (int c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    inDataPtr = me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (
                me->alloc_fn, me->free_fn, &(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (int csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS)
            rv = LossyDctEncoder_execute (me->alloc_fn, me->free_fn, &enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (
                            me->alloc_fn, me->free_fn, &enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += (uint64_t) pchan->width *
                                   (uint64_t) pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize = (size_t) pchan->width *
                                          (size_t) pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS) return rv;

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    me->_encode->context,
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS) return rv;

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            me->_encode->scratch_buffer_1, me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_encode->context,
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        size_t compBytes;
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}